

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.c
# Opt level: O1

void witness_depth_error_impl(witness_list_t *witnesses,witness_rank_t rank_inclusive,uint depth)

{
  char *pcVar1;
  witness_t *pwVar2;
  
  pcVar1 = "s";
  if (depth == 1) {
    pcVar1 = "";
  }
  malloc_printf("<jemalloc>: Should own %u lock%s of rank >= %u:",(ulong)depth,pcVar1,rank_inclusive
               );
  pwVar2 = witnesses->qlh_first;
  while (pwVar2 != (witness_t *)0x0) {
    malloc_printf(" %s(%u)",pwVar2->name,(ulong)pwVar2->rank);
    pwVar2 = (pwVar2->link).qre_next;
    if (pwVar2 == witnesses->qlh_first) {
      pwVar2 = (witness_t *)0x0;
    }
  }
  malloc_printf("\n");
  abort();
}

Assistant:

static void
witness_depth_error_impl(const witness_list_t *witnesses,
    witness_rank_t rank_inclusive, unsigned depth) {
	witness_t *w;

	malloc_printf("<jemalloc>: Should own %u lock%s of rank >= %u:", depth,
	    (depth != 1) ?  "s" : "", rank_inclusive);
	ql_foreach(w, witnesses, link) {
		malloc_printf(" %s(%u)", w->name, w->rank);
	}
	malloc_printf("\n");
	abort();
}